

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  float *pfVar7;
  uchar *puVar8;
  long lVar9;
  nk_context *nk;
  uchar state_00;
  undefined8 uVar10;
  GLFWgamepadstate *pGVar11;
  ulong uVar12;
  ulong uVar13;
  nk_rect bounds;
  nk_rect bounds_00;
  int old_val;
  int hat_count;
  int button_count;
  int axis_count;
  int height;
  int width;
  GLFWgamepadstate state;
  float local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  long local_70;
  GLFWgamepadstate local_68;
  uchar *local_38;
  
  joysticks[0xc] = 0;
  joysticks[0xd] = 0;
  joysticks[0xe] = 0;
  joysticks[0xf] = 0;
  joysticks[8] = 0;
  joysticks[9] = 0;
  joysticks[10] = 0;
  joysticks[0xb] = 0;
  joysticks[4] = 0;
  joysticks[5] = 0;
  joysticks[6] = 0;
  joysticks[7] = 0;
  joysticks[0] = 0;
  joysticks[1] = 0;
  joysticks[2] = 0;
  joysticks[3] = 0;
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x2200c,1);
    iVar2 = 0;
    window = glfwCreateWindow(800,600,"Joystick Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (window != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(window);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      nk_glfw3_init(window,NK_GLFW3_INSTALL_CALLBACKS);
      memset(&glfw.atlas,0,400);
      glfw.atlas.temporary.alloc = nk_malloc;
      glfw.atlas.temporary.free = nk_mfree;
      glfw.atlas.permanent.alloc = nk_malloc;
      glfw.atlas.permanent.free = nk_mfree;
      nk_font_atlas_begin(&glfw.atlas);
      nk_glfw3_font_stash_end();
      do {
        iVar3 = glfwJoystickPresent(iVar2);
        if (iVar3 != 0) {
          lVar5 = (long)joystick_count;
          joystick_count = joystick_count + 1;
          joysticks[lVar5] = iVar2;
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0x10);
      glfwSetJoystickCallback(joystick_callback);
      glfwSetDropCallback(window,drop_callback);
      iVar2 = glfwWindowShouldClose(window);
      if (iVar2 == 0) {
        local_88 = 0;
        do {
          glfwGetWindowSize(window,&local_74,&local_78);
          (*glad_glClear)(0x4000);
          nk_glfw3_new_frame();
          bounds.h = (float)local_78;
          bounds.w = 200.0;
          bounds.y = 0.0;
          bounds.x = (float)local_74 + -200.0;
          iVar2 = nk_begin_titled(&glfw.ctx,"Joysticks","Joysticks",bounds,0x50);
          if (iVar2 != 0) {
            nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,1,0);
            local_88 = nk_check_text(&glfw.ctx,"Hat buttons",0xb,local_88);
            if (joystick_count == 0) {
              nk_text_colored(&glfw.ctx,"No joysticks connected",0x16,0x11,glfw.ctx.style.text.color
                             );
            }
            else if (0 < joystick_count) {
              lVar5 = 0;
              do {
                iVar2 = joysticks[lVar5];
                pcVar6 = glfwGetJoystickName(iVar2);
                lVar9 = 0;
                snprintf(&joystick_label_label,0x400,"%i: %s",(ulong)(iVar2 + 1),pcVar6);
                if (joystick_label_label != '\0') {
                  lVar9 = 0;
                  do {
                    pcVar6 = &DAT_001a3a31 + lVar9;
                    lVar9 = lVar9 + 1;
                  } while (*pcVar6 != '\0');
                }
                iVar2 = nk_button_text_styled
                                  (&glfw.ctx,&glfw.ctx.style.button,&joystick_label_label,(int)lVar9
                                  );
                if (iVar2 != 0) {
                  iVar2 = joysticks[lVar5];
                  pcVar6 = glfwGetJoystickName(iVar2);
                  snprintf(&joystick_label_label,0x400,"%i: %s",(ulong)(iVar2 + 1),pcVar6);
                  nk_window_set_focus(&glfw.ctx,&joystick_label_label);
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < joystick_count);
            }
          }
          nk_end(&glfw.ctx);
          if (0 < joystick_count) {
            lVar5 = 0;
            do {
              iVar2 = joysticks[lVar5];
              pcVar6 = glfwGetJoystickName(iVar2);
              snprintf(&joystick_label_label,0x400,"%i: %s",(ulong)(iVar2 + 1),pcVar6);
              bounds_00.x = (float)(int)lVar5 * 20.0;
              bounds_00.y = bounds_00.x;
              bounds_00.w = 550.0;
              bounds_00.h = 570.0;
              iVar2 = nk_begin_titled(&glfw.ctx,&joystick_label_label,&joystick_label_label,
                                      bounds_00,0x57);
              if (iVar2 != 0) {
                nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,1,0);
                pcVar6 = glfwGetJoystickGUID(joysticks[lVar5]);
                nk_labelf(&glfw.ctx,0x11,"Hardware GUID %s",pcVar6);
                nk_text_colored(&glfw.ctx,"Joystick state",0xe,0x11,glfw.ctx.style.text.color);
                pfVar7 = glfwGetJoystickAxes(joysticks[lVar5],&local_7c);
                puVar8 = glfwGetJoystickButtons(joysticks[lVar5],&local_80);
                local_70 = lVar5;
                local_38 = glfwGetJoystickHats(joysticks[lVar5],&local_84);
                if (local_88 == 0) {
                  local_80 = local_80 + local_84 * -4;
                }
                if (0 < local_7c) {
                  lVar5 = 0;
                  do {
                    local_68.buttons._0_4_ = pfVar7[lVar5];
                    nk_slider_float(&glfw.ctx,-1.0,(float *)&local_68,1.0,0.1);
                    lVar5 = lVar5 + 1;
                  } while (lVar5 < local_7c);
                }
                nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,0xc,0);
                if (0 < local_80) {
                  uVar12 = 0;
                  do {
                    uVar13 = uVar12 + 1;
                    lVar5 = 0;
                    snprintf((char *)&local_68,0x10,"%i",uVar13 & 0xffffffff);
                    local_8c = (float)(uint)puVar8[uVar12];
                    if (local_68.buttons[0] != '\0') {
                      lVar5 = 0;
                      do {
                        lVar9 = lVar5 + 1;
                        lVar5 = lVar5 + 1;
                      } while (local_68.buttons[lVar9] != '\0');
                    }
                    nk_selectable_text(&glfw.ctx,(char *)&local_68,(int)lVar5,0x12,(int *)&local_8c)
                    ;
                    uVar12 = uVar13;
                  } while ((long)uVar13 < (long)local_80);
                }
                uVar10 = 0;
                nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,8,0);
                puVar8 = local_38;
                if (0 < local_84) {
                  lVar5 = 0;
                  do {
                    hat_widget((nk_context *)(ulong)puVar8[lVar5],(uchar)uVar10);
                    lVar5 = lVar5 + 1;
                  } while (lVar5 < local_84);
                }
                nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,1,0);
                lVar5 = local_70;
                iVar2 = glfwGetGamepadState(joysticks[local_70],&local_68);
                if (iVar2 == 0) {
                  nk_text_colored(&glfw.ctx,"Joystick has no gamepad mapping",0x1f,0x11,
                                  glfw.ctx.style.text.color);
                }
                else {
                  glfwGetGamepadName(joysticks[lVar5]);
                  nk_labelf(&glfw.ctx,0x11,"Gamepad state: %s");
                  nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,2,0);
                  lVar5 = 0;
                  do {
                    local_8c = local_68.axes[lVar5];
                    nk_slider_float(&glfw.ctx,-1.0,&local_8c,1.0,0.1);
                    lVar5 = lVar5 + 1;
                  } while (lVar5 != 6);
                  nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,0xb,0);
                  lVar5 = 0;
                  pGVar11 = &local_68;
                  do {
                    pcVar6 = *(char **)((long)&DAT_0019dca0 + lVar5);
                    local_8c = (float)(uint)pGVar11->buttons[0];
                    iVar2 = nk_strlen(pcVar6);
                    nk_selectable_text(&glfw.ctx,pcVar6,iVar2,0x12,(int *)&local_8c);
                    pGVar11 = (GLFWgamepadstate *)(pGVar11->buttons + 1);
                    lVar5 = lVar5 + 8;
                  } while (lVar5 != 0x58);
                  uVar1 = (local_68.buttons[0xb] != '\0') + 2;
                  if (local_68.buttons[0xc] == '\0') {
                    uVar1 = (uint)(local_68.buttons[0xb] != '\0');
                  }
                  uVar4 = uVar1 + 4;
                  if (local_68.buttons[0xd] == '\0') {
                    uVar4 = uVar1;
                  }
                  nk = (nk_context *)((ulong)uVar4 | 8);
                  if (local_68.buttons[0xe] == '\0') {
                    nk = (nk_context *)(ulong)uVar4;
                  }
                  state_00 = '\0';
                  nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,8,0);
                  hat_widget(nk,state_00);
                  lVar5 = local_70;
                }
              }
              nk_end(&glfw.ctx);
              lVar5 = lVar5 + 1;
            } while (lVar5 < joystick_count);
          }
          nk_glfw3_render(NK_ANTI_ALIASING_ON);
          glfwSwapBuffers(window);
          glfwPollEvents();
          iVar2 = glfwWindowShouldClose(window);
        } while (iVar2 == 0);
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int jid, hat_buttons = GLFW_FALSE;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    memset(joysticks, 0, sizeof(joysticks));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);

    window = glfwCreateWindow(800, 600, "Joystick Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    for (jid = GLFW_JOYSTICK_1;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (glfwJoystickPresent(jid))
            joysticks[joystick_count++] = jid;
    }

    glfwSetJoystickCallback(joystick_callback);
    glfwSetDropCallback(window, drop_callback);

    while (!glfwWindowShouldClose(window))
    {
        int i, width, height;

        glfwGetWindowSize(window, &width, &height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();

        if (nk_begin(nk,
                     "Joysticks",
                     nk_rect(width - 200.f, 0.f, 200.f, (float) height),
                     NK_WINDOW_MINIMIZABLE |
                     NK_WINDOW_TITLE))
        {
            nk_layout_row_dynamic(nk, 30, 1);

            nk_checkbox_label(nk, "Hat buttons", &hat_buttons);

            if (joystick_count)
            {
                for (i = 0;  i < joystick_count;  i++)
                {
                    if (nk_button_label(nk, joystick_label(joysticks[i])))
                        nk_window_set_focus(nk, joystick_label(joysticks[i]));
                }
            }
            else
                nk_label(nk, "No joysticks connected", NK_TEXT_LEFT);
        }

        nk_end(nk);

        for (i = 0;  i < joystick_count;  i++)
        {
            if (nk_begin(nk,
                         joystick_label(joysticks[i]),
                         nk_rect(i * 20.f, i * 20.f, 550.f, 570.f),
                         NK_WINDOW_BORDER |
                         NK_WINDOW_MOVABLE |
                         NK_WINDOW_SCALABLE |
                         NK_WINDOW_MINIMIZABLE |
                         NK_WINDOW_TITLE))
            {
                int j, axis_count, button_count, hat_count;
                const float* axes;
                const unsigned char* buttons;
                const unsigned char* hats;
                GLFWgamepadstate state;

                nk_layout_row_dynamic(nk, 30, 1);
                nk_labelf(nk, NK_TEXT_LEFT, "Hardware GUID %s",
                          glfwGetJoystickGUID(joysticks[i]));
                nk_label(nk, "Joystick state", NK_TEXT_LEFT);

                axes = glfwGetJoystickAxes(joysticks[i], &axis_count);
                buttons = glfwGetJoystickButtons(joysticks[i], &button_count);
                hats = glfwGetJoystickHats(joysticks[i], &hat_count);

                if (!hat_buttons)
                    button_count -= hat_count * 4;

                for (j = 0;  j < axis_count;  j++)
                    nk_slide_float(nk, -1.f, axes[j], 1.f, 0.1f);

                nk_layout_row_dynamic(nk, 30, 12);

                for (j = 0;  j < button_count;  j++)
                {
                    char name[16];
                    snprintf(name, sizeof(name), "%i", j + 1);
                    nk_select_label(nk, name, NK_TEXT_CENTERED, buttons[j]);
                }

                nk_layout_row_dynamic(nk, 30, 8);

                for (j = 0;  j < hat_count;  j++)
                    hat_widget(nk, hats[j]);

                nk_layout_row_dynamic(nk, 30, 1);

                if (glfwGetGamepadState(joysticks[i], &state))
                {
                    int hat = 0;
                    const char* names[GLFW_GAMEPAD_BUTTON_LAST + 1 - 4] =
                    {
                        "A", "B", "X", "Y",
                        "LB", "RB",
                        "Back", "Start", "Guide",
                        "LT", "RT",
                    };

                    nk_labelf(nk, NK_TEXT_LEFT,
                              "Gamepad state: %s",
                              glfwGetGamepadName(joysticks[i]));

                    nk_layout_row_dynamic(nk, 30, 2);

                    for (j = 0;  j <= GLFW_GAMEPAD_AXIS_LAST;  j++)
                        nk_slide_float(nk, -1.f, state.axes[j], 1.f, 0.1f);

                    nk_layout_row_dynamic(nk, 30, GLFW_GAMEPAD_BUTTON_LAST + 1 - 4);

                    for (j = 0;  j <= GLFW_GAMEPAD_BUTTON_LAST - 4;  j++)
                        nk_select_label(nk, names[j], NK_TEXT_CENTERED, state.buttons[j]);

                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_UP])
                        hat |= GLFW_HAT_UP;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_RIGHT])
                        hat |= GLFW_HAT_RIGHT;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_DOWN])
                        hat |= GLFW_HAT_DOWN;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_LEFT])
                        hat |= GLFW_HAT_LEFT;

                    nk_layout_row_dynamic(nk, 30, 8);
                    hat_widget(nk, hat);
                }
                else
                    nk_label(nk, "Joystick has no gamepad mapping", NK_TEXT_LEFT);
            }

            nk_end(nk);
        }

        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}